

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app3.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *item;
  initializer_list<float> __l;
  allocator_type local_31;
  vector<float,_std::allocator<float>_> v;
  float local_18 [4];
  
  local_18[0] = 10.1;
  local_18[1] = 20.2;
  local_18[2] = 30.3;
  __l._M_len = 3;
  __l._M_array = local_18;
  std::vector<float,_std::allocator<float>_>::vector(&v,__l,&local_31);
  print<std::vector<float,std::allocator<float>>>(&v);
  transform<std::vector<float,std::allocator<float>>,Increment<float>>
            (&v,(Increment<float>)0x40600000);
  print<std::vector<float,std::allocator<float>>>(&v);
  for (; v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
           v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start + 1) {
    *v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         *v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start *
         *v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start;
  }
  print<std::vector<float,std::allocator<float>>>(&v);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&v.super__Vector_base<float,_std::allocator<float>_>);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//    auto increment_by5 = Increment{5};
//    auto increment_by10 = Increment{10};
////    increment.operator()();
//    auto i = 100;
//    for(int k=0; k<3; ++k)
//        increment_by5(i);
//    cout << i << endl;

    auto v = vector<float>{10.1, 20.2, 30.3};
    print(v);

//    by_what = 3;
    transform(v, Increment<float>{3.5f});
    print(v);

//    transform(v, Square{});
    auto square = [](auto& item) { item = item*item; };
    transform(v, square);
    print(v);

    return 0;
}